

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_read.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint8_t *puVar2;
  bool bVar3;
  ostream *poVar4;
  size_t size;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  long lVar6;
  size_t __nbytes;
  excerpt_tailer tailer;
  vanilla_chronicle_settings settings;
  vanilla_chronicle chronicle;
  char local_271;
  excerpt_tailer local_270;
  vanilla_chronicle_settings local_218;
  vanilla_chronicle local_1b8;
  
  paVar1 = &local_1b8.m_settings.m_path.field_2;
  local_1b8.m_settings.m_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"/tmp/example","");
  cornelich::vanilla_chronicle_settings::vanilla_chronicle_settings(&local_218,(string *)&local_1b8)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.m_settings.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8.m_settings.m_path._M_dataplus._M_p);
  }
  cornelich::vanilla_chronicle::vanilla_chronicle(&local_1b8,&local_218);
  cornelich::vanilla_chronicle::create_tailer(&local_270,&local_1b8);
  do {
    do {
      bVar3 = cornelich::excerpt_tailer::next_index(&local_270);
    } while (!bVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"int:  ",6);
    lVar6 = (long)local_270.m_buffer.m_position;
    local_270.m_buffer.m_position = local_270.m_buffer.m_position + 4;
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,*(int *)(local_270.m_buffer.m_data + lVar6));
    local_271 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_271,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"text: ",6);
    puVar2 = local_270.m_buffer.m_data;
    size = cornelich::util::stop_bit::read
                     ((int)local_270.m_buffer.m_data,&local_270.m_buffer.m_position,__nbytes);
    lVar6 = (long)local_270.m_buffer.m_position;
    local_270.m_buffer.m_position = local_270.m_buffer.m_position + (int)size;
    pbVar5 = boost::io::ostream_put<char,std::char_traits<char>>
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                        (char *)(puVar2 + lVar6),size);
    local_271 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(pbVar5,&local_271,1);
  } while( true );
}

Assistant:

int main()
{
    chr::vanilla_chronicle_settings settings("/tmp/example");
    chr::vanilla_chronicle chronicle(settings);

    auto tailer = chronicle.create_tailer();
    while(true)
    {
        if(!tailer.next_index())
            continue;
        std::cout << "int:  " << tailer.read<int>() << '\n';
        std::cout << "text: " << tailer.read(chr::readers::chars()) << '\n';
    }

}